

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_bigint_value
          (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_view_type *sv)

{
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  bignum_format_kind bVar2;
  container_type *pcVar3;
  bool bVar4;
  type_conflict2 tVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  bigint n;
  int signum;
  basic_bigint<std::allocator<unsigned_char>_> v_3;
  basic_bigint<std::allocator<unsigned_char>_> v_1;
  basic_bigint<std::allocator<unsigned_char>_> local_c8;
  basic_bigint<std::allocator<unsigned_char>_> local_a0;
  int local_74;
  basic_bigint<std::allocator<unsigned_char>_> local_70;
  basic_bigint<std::allocator<unsigned_char>_> local_48;
  
  bVar2 = (this->options_).bignum_format_;
  if (bVar2 == base64url) {
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_a0,sv->_M_str,sv->_M_len)
    ;
    bVar4 = operator<(&local_a0,0);
    if (bVar4) {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_70,&local_a0);
      local_70.field_0._0_1_ = local_70.field_0._0_1_ ^ 2;
      jsoncons::operator-(&local_c8,&local_70,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_a0,&local_c8);
      if (((local_c8.field_0._0_8_ & 1) != 0) &&
         ((pointer)local_c8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_c8.field_0.dynamic_stor_.data_,
                        local_c8.field_0.short_stor_.values_[0] << 3);
      }
      if (((local_70.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_70.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_70.field_0.dynamic_stor_.data_,
                        local_70.field_0.short_stor_.values_[0] << 3);
      }
    }
    local_c8._0_8_ = (uchar *)0x0;
    local_c8.field_0._0_8_ = (uchar *)0x0;
    local_c8.field_0.common_stor_.length_ = 0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&local_a0,&local_74,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
    psVar1 = &this->sink_;
    if (bVar4) {
      std::__cxx11::string::push_back((char)psVar1->buf_ptr);
      this->column_ = this->column_ + 1;
    }
    tVar5 = detail::
            encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::string_sink<std::__cxx11::string>>
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_c8._0_8_,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_c8.field_0._0_8_,
                       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",psVar1);
    std::__cxx11::string::push_back((char)psVar1->buf_ptr);
  }
  else {
    if (bVar2 != base64) {
      if (bVar2 == number) {
        pcVar3 = (this->sink_).buf_ptr;
        std::__cxx11::string::replace
                  ((ulong)pcVar3,pcVar3->_M_string_length,(char *)0x0,(ulong)sv->_M_str);
        this->column_ = this->column_ + sv->_M_len;
        return;
      }
      std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
      pcVar3 = (this->sink_).buf_ptr;
      std::__cxx11::string::replace
                ((ulong)pcVar3,pcVar3->_M_string_length,(char *)0x0,(ulong)sv->_M_str);
      std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
      this->column_ = sv->_M_len + this->column_ + 2;
      return;
    }
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_a0,sv->_M_str,sv->_M_len)
    ;
    bVar4 = operator<(&local_a0,0);
    if (bVar4) {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_48,&local_a0);
      local_48.field_0._0_1_ = local_48.field_0._0_1_ ^ 2;
      jsoncons::operator-(&local_c8,&local_48,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_a0,&local_c8);
      if (((local_c8.field_0._0_8_ & 1) != 0) &&
         ((pointer)local_c8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_c8.field_0.dynamic_stor_.data_,
                        local_c8.field_0.short_stor_.values_[0] << 3);
      }
      if (((local_48.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_48.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_48.field_0.dynamic_stor_.data_,
                        local_48.field_0.short_stor_.values_[0] << 3);
      }
    }
    local_c8._0_8_ = (uchar *)0x0;
    local_c8.field_0._0_8_ = (uchar *)0x0;
    local_c8.field_0.common_stor_.length_ = 0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&local_a0,&local_74,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
    psVar1 = &this->sink_;
    if (bVar4) {
      std::__cxx11::string::push_back((char)psVar1->buf_ptr);
      this->column_ = this->column_ + 1;
    }
    tVar5 = detail::
            encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::string_sink<std::__cxx11::string>>
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_c8._0_8_,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_c8.field_0._0_8_,
                       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/=",psVar1);
    std::__cxx11::string::push_back((char)psVar1->buf_ptr);
  }
  this->column_ = this->column_ + tVar5 + 2;
  if ((uchar *)local_c8._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8.field_0.common_stor_.length_ - local_c8._0_8_);
  }
  if (((local_a0.field_0._0_1_ & 1) != 0) &&
     ((pointer)local_a0.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(local_a0.field_0.dynamic_stor_.data_,
                    local_a0.field_0.short_stor_.values_[0] << 3);
  }
  return;
}

Assistant:

void write_bigint_value(const string_view_type& sv)
        {
            switch (options_.bignum_format())
            {
                case bignum_format_kind::raw:
                {
                    sink_.append(sv.data(),sv.size());
                    column_ += sv.size();
                    break;
                }
                case bignum_format_kind::base64:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                        ++column_;
                    }
                    std::size_t length = encode_base64(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length+2);
                    break;
                }
                case bignum_format_kind::base64url:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                        ++column_;
                    }
                    std::size_t length = encode_base64url(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length+2);
                    break;
                }
                default:
                {
                    sink_.push_back('\"');
                    sink_.append(sv.data(),sv.size());
                    sink_.push_back('\"');
                    column_ += (sv.size() + 2);
                    break;
                }
            }
        }